

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_function_relation.cpp
# Opt level: O2

string * __thiscall
duckdb::TableFunctionRelation::GetAlias_abi_cxx11_
          (string *__return_storage_ptr__,TableFunctionRelation *this)

{
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->name);
  return __return_storage_ptr__;
}

Assistant:

string TableFunctionRelation::GetAlias() {
	return name;
}